

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comparison_simplification.cpp
# Opt level: O0

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::ComparisonSimplificationRule::Apply
          (ComparisonSimplificationRule *this,LogicalOperator *op,
          vector<std::reference_wrapper<duckdb::Expression>,_true> *bindings,bool *changes_made,
          bool is_root)

{
  undefined1 uVar1;
  undefined1 uVar2;
  ExpressionClass EVar3;
  LogicalTypeId strict;
  undefined1 uVar4;
  bool bVar5;
  reference pvVar6;
  pointer pEVar7;
  ClientContext *target_type_00;
  BoundCastExpression *error_message_00;
  ClientContext *in_RSI;
  Expression *in_RDI;
  byte in_R9B;
  templated_unique_single_t new_constant_expr;
  type child_expression;
  Value uncast_constant;
  bool new_constant;
  Value cast_constant;
  string error_message;
  LogicalType target_type;
  BoundCastExpression *cast_expression;
  Value constant_value;
  pointer column_ref_expr;
  bool column_ref_left;
  Expression *constant_expr;
  BoundComparisonExpression *expr;
  Value *in_stack_fffffffffffffd68;
  undefined6 in_stack_fffffffffffffd70;
  undefined1 in_stack_fffffffffffffd76;
  undefined1 in_stack_fffffffffffffd77;
  BoundCastExpression *in_stack_fffffffffffffd78;
  Value *in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd88;
  undefined1 in_stack_fffffffffffffd8c;
  undefined1 in_stack_fffffffffffffd8d;
  undefined1 in_stack_fffffffffffffd8e;
  LogicalTypeId in_stack_fffffffffffffd8f;
  LogicalType *in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd98;
  undefined4 uVar8;
  ExpressionType in_stack_fffffffffffffd9c;
  ExpressionType in_stack_fffffffffffffd9d;
  ClientContext *context;
  BaseExpression *in_stack_fffffffffffffdb0;
  _Head_base<0UL,_duckdb::Expression_*,_false> expr_00;
  Value *in_stack_fffffffffffffdd8;
  Value local_198;
  string local_158 [56];
  BoundCastExpression *local_120;
  int local_b8;
  undefined1 local_a8 [88];
  pointer local_50;
  byte local_41;
  Expression *local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_38 [3];
  
  local_38[0]._15_1_ = in_R9B & 1;
  expr_00._M_head_impl = in_RDI;
  pvVar6 = vector<std::reference_wrapper<duckdb::Expression>,_true>::operator[]
                     ((vector<std::reference_wrapper<duckdb::Expression>,_true> *)
                      CONCAT17(in_stack_fffffffffffffd77,
                               CONCAT16(in_stack_fffffffffffffd76,in_stack_fffffffffffffd70)),
                      (size_type)in_stack_fffffffffffffd68);
  ::std::reference_wrapper<duckdb::Expression>::get(pvVar6);
  local_38[0]._0_8_ =
       BaseExpression::Cast<duckdb::BoundComparisonExpression>(in_stack_fffffffffffffdb0);
  pvVar6 = vector<std::reference_wrapper<duckdb::Expression>,_true>::operator[]
                     ((vector<std::reference_wrapper<duckdb::Expression>,_true> *)
                      CONCAT17(in_stack_fffffffffffffd77,
                               CONCAT16(in_stack_fffffffffffffd76,in_stack_fffffffffffffd70)),
                      (size_type)in_stack_fffffffffffffd68);
  local_40 = ::std::reference_wrapper<duckdb::Expression>::get(pvVar6);
  pEVar7 = ::std::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>::get
                     ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_> *)
                      CONCAT17(in_stack_fffffffffffffd77,
                               CONCAT16(in_stack_fffffffffffffd76,in_stack_fffffffffffffd70)));
  local_41 = pEVar7 != local_40;
  if ((bool)local_41) {
    pEVar7 = ::std::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>::get
                       ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_> *)
                        CONCAT17(in_stack_fffffffffffffd77,
                                 CONCAT16(in_stack_fffffffffffffd76,in_stack_fffffffffffffd70)));
  }
  else {
    pEVar7 = ::std::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>::get
                       ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_> *)
                        CONCAT17(in_stack_fffffffffffffd77,
                                 CONCAT16(in_stack_fffffffffffffd76,in_stack_fffffffffffffd70)));
  }
  context = (ClientContext *)local_a8;
  local_50 = pEVar7;
  LogicalType::LogicalType(in_stack_fffffffffffffd90,in_stack_fffffffffffffd8f);
  Value::Value(in_stack_fffffffffffffd80,(LogicalType *)in_stack_fffffffffffffd78);
  LogicalType::~LogicalType((LogicalType *)0xcd9ce2);
  target_type_00 = Rule::GetContext((Rule *)in_RSI);
  uVar1 = ExpressionExecutor::TryEvaluateScalar(in_RSI,expr_00._M_head_impl,(Value *)in_RDI);
  if (!(bool)uVar1) {
    unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>::
    unique_ptr<std::default_delete<duckdb::Expression>,void>
              ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               CONCAT17(in_stack_fffffffffffffd77,
                        CONCAT16(in_stack_fffffffffffffd76,in_stack_fffffffffffffd70)),
               in_stack_fffffffffffffd68);
    local_b8 = 1;
    goto LAB_00cda39c;
  }
  uVar2 = Value::IsNull((Value *)(local_a8 + 0x18));
  if ((((bool)uVar2) &&
      (in_stack_fffffffffffffd9d =
            BaseExpression::GetExpressionType((BaseExpression *)local_38[0]._0_8_),
      in_stack_fffffffffffffd9d != COMPARE_BOUNDARY_END)) &&
     (in_stack_fffffffffffffd9c =
           BaseExpression::GetExpressionType((BaseExpression *)local_38[0]._0_8_),
     in_stack_fffffffffffffd9c != COMPARE_DISTINCT_FROM)) {
    LogicalType::LogicalType(in_stack_fffffffffffffd90,in_stack_fffffffffffffd8f);
    Value::Value(in_stack_fffffffffffffd80,(LogicalType *)in_stack_fffffffffffffd78);
    make_uniq<duckdb::BoundConstantExpression,duckdb::Value>(in_stack_fffffffffffffdd8);
    unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>::
    unique_ptr<duckdb::BoundConstantExpression,std::default_delete<std::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>>>,void>
              ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               CONCAT17(in_stack_fffffffffffffd77,
                        CONCAT16(in_stack_fffffffffffffd76,in_stack_fffffffffffffd70)),
               (unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>_>
                *)in_stack_fffffffffffffd68);
    unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>
    ::~unique_ptr((unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>
                   *)0xcd9e39);
    Value::~Value((Value *)CONCAT17(in_stack_fffffffffffffd77,
                                    CONCAT16(in_stack_fffffffffffffd76,in_stack_fffffffffffffd70)));
    LogicalType::~LogicalType((LogicalType *)0xcd9e53);
    local_b8 = 1;
    goto LAB_00cda39c;
  }
  EVar3 = BaseExpression::GetExpressionClass(&local_50->super_BaseExpression);
  uVar8 = CONCAT13(EVar3,(int3)in_stack_fffffffffffffd98);
  if (EVar3 == BOUND_CAST) {
    error_message_00 =
         BaseExpression::Cast<duckdb::BoundCastExpression>(&pEVar7->super_BaseExpression);
    local_120 = error_message_00;
    BoundCastExpression::source_type(in_stack_fffffffffffffd78);
    strict = BoundCastExpression::CastIsInvertible
                       ((LogicalType *)
                        CONCAT17(in_stack_fffffffffffffd8f,
                                 CONCAT16(in_stack_fffffffffffffd8e,
                                          CONCAT15(in_stack_fffffffffffffd8d,
                                                   CONCAT14(in_stack_fffffffffffffd8c,
                                                            in_stack_fffffffffffffd88)))),
                        &in_stack_fffffffffffffd80->type_);
    if ((bool)strict) {
      ::std::__cxx11::string::string(local_158);
      LogicalType::LogicalType((LogicalType *)error_message_00,strict);
      Value::Value(in_stack_fffffffffffffd80,(LogicalType *)in_stack_fffffffffffffd78);
      LogicalType::~LogicalType((LogicalType *)0xcd9fa8);
      uVar4 = Value::TryCastAs((Value *)pEVar7,context,(LogicalType *)target_type_00,
                               (Value *)CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(
                                                  in_stack_fffffffffffffd9d,
                                                  CONCAT14(in_stack_fffffffffffffd9c,uVar8)))),
                               (string *)error_message_00,(bool)strict);
      if ((bool)uVar4) {
        bVar5 = Value::IsNull(&local_198);
        if ((!bVar5) &&
           (bVar5 = BoundCastExpression::CastIsInvertible
                              ((LogicalType *)
                               CONCAT17(strict,CONCAT16(uVar4,CONCAT15(bVar5,CONCAT14(
                                                  in_stack_fffffffffffffd8c,
                                                  in_stack_fffffffffffffd88)))),
                               &in_stack_fffffffffffffd80->type_), !bVar5)) {
          LogicalType::LogicalType((LogicalType *)error_message_00,strict);
          Value::Value(in_stack_fffffffffffffd80,(LogicalType *)in_stack_fffffffffffffd78);
          LogicalType::~LogicalType((LogicalType *)0xcda0f9);
          Value::type((Value *)(local_a8 + 0x18));
          in_stack_fffffffffffffd77 =
               Value::TryCastAs((Value *)pEVar7,context,(LogicalType *)target_type_00,
                                (Value *)CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(
                                                  in_stack_fffffffffffffd9d,
                                                  CONCAT14(in_stack_fffffffffffffd9c,uVar8)))),
                                (string *)error_message_00,(bool)strict);
          if ((!(bool)in_stack_fffffffffffffd77) ||
             (in_stack_fffffffffffffd76 =
                   Value::operator!=((Value *)CONCAT17(in_stack_fffffffffffffd77,
                                                       CONCAT16(in_stack_fffffffffffffd76,
                                                                in_stack_fffffffffffffd70)),
                                     in_stack_fffffffffffffd68), (bool)in_stack_fffffffffffffd76)) {
            unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>::
            unique_ptr<std::default_delete<duckdb::Expression>,void>
                      ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        *)CONCAT17(in_stack_fffffffffffffd77,
                                   CONCAT16(in_stack_fffffffffffffd76,in_stack_fffffffffffffd70)),
                       in_stack_fffffffffffffd68);
            local_b8 = 1;
          }
          else {
            local_b8 = 0;
          }
          Value::~Value((Value *)CONCAT17(in_stack_fffffffffffffd77,
                                          CONCAT16(in_stack_fffffffffffffd76,
                                                   in_stack_fffffffffffffd70)));
          if (local_b8 != 0) goto LAB_00cda324;
        }
        unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::unique_ptr
                  ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   CONCAT17(in_stack_fffffffffffffd77,
                            CONCAT16(in_stack_fffffffffffffd76,in_stack_fffffffffffffd70)),
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   in_stack_fffffffffffffd68);
        make_uniq<duckdb::BoundConstantExpression,duckdb::Value&>((Value *)in_RSI);
        if ((local_41 & 1) == 0) {
          unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>::
          unique_ptr<duckdb::BoundConstantExpression,std::default_delete<std::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>>>,void>
                    ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)CONCAT17(in_stack_fffffffffffffd77,
                                 CONCAT16(in_stack_fffffffffffffd76,in_stack_fffffffffffffd70)),
                     (unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>_>
                      *)in_stack_fffffffffffffd68);
          unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator=
                    ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)CONCAT17(in_stack_fffffffffffffd77,
                                 CONCAT16(in_stack_fffffffffffffd76,in_stack_fffffffffffffd70)),
                     (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)in_stack_fffffffffffffd68);
          unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::~unique_ptr
                    ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)0xcda2e9);
          unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator=
                    ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)CONCAT17(in_stack_fffffffffffffd77,
                                 CONCAT16(in_stack_fffffffffffffd76,in_stack_fffffffffffffd70)),
                     (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)in_stack_fffffffffffffd68);
        }
        else {
          unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator=
                    ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)CONCAT17(in_stack_fffffffffffffd77,
                                 CONCAT16(in_stack_fffffffffffffd76,in_stack_fffffffffffffd70)),
                     (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)in_stack_fffffffffffffd68);
          unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>::
          unique_ptr<duckdb::BoundConstantExpression,std::default_delete<std::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>>>,void>
                    ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)CONCAT17(in_stack_fffffffffffffd77,
                                 CONCAT16(in_stack_fffffffffffffd76,in_stack_fffffffffffffd70)),
                     (unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>_>
                      *)in_stack_fffffffffffffd68);
          unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator=
                    ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)CONCAT17(in_stack_fffffffffffffd77,
                                 CONCAT16(in_stack_fffffffffffffd76,in_stack_fffffffffffffd70)),
                     (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)in_stack_fffffffffffffd68);
          unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::~unique_ptr
                    ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)0xcda292);
        }
        unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>
        ::~unique_ptr((unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>
                       *)0xcda30c);
        unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::~unique_ptr
                  ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   0xcda319);
        local_b8 = 0;
      }
      else {
        unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>::
        unique_ptr<std::default_delete<duckdb::Expression>,void>
                  ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   CONCAT17(in_stack_fffffffffffffd77,
                            CONCAT16(in_stack_fffffffffffffd76,in_stack_fffffffffffffd70)),
                   in_stack_fffffffffffffd68);
        local_b8 = 1;
      }
LAB_00cda324:
      Value::~Value((Value *)CONCAT17(in_stack_fffffffffffffd77,
                                      CONCAT16(in_stack_fffffffffffffd76,in_stack_fffffffffffffd70))
                   );
      ::std::__cxx11::string::~string(local_158);
    }
    else {
      unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>::
      unique_ptr<std::default_delete<duckdb::Expression>,void>
                ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 CONCAT17(in_stack_fffffffffffffd77,
                          CONCAT16(in_stack_fffffffffffffd76,in_stack_fffffffffffffd70)),
                 in_stack_fffffffffffffd68);
      local_b8 = 1;
    }
    LogicalType::~LogicalType((LogicalType *)0xcda34b);
    if (local_b8 != 0) goto LAB_00cda39c;
  }
  unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>::
  unique_ptr<std::default_delete<duckdb::Expression>,void>
            ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             CONCAT17(in_stack_fffffffffffffd77,
                      CONCAT16(in_stack_fffffffffffffd76,in_stack_fffffffffffffd70)),
             in_stack_fffffffffffffd68);
  local_b8 = 1;
LAB_00cda39c:
  Value::~Value((Value *)CONCAT17(in_stack_fffffffffffffd77,
                                  CONCAT16(in_stack_fffffffffffffd76,in_stack_fffffffffffffd70)));
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
         expr_00._M_head_impl;
}

Assistant:

unique_ptr<Expression> ComparisonSimplificationRule::Apply(LogicalOperator &op, vector<reference<Expression>> &bindings,
                                                           bool &changes_made, bool is_root) {

	auto &expr = bindings[0].get().Cast<BoundComparisonExpression>();
	auto &constant_expr = bindings[1].get();
	bool column_ref_left = expr.left.get() != &constant_expr;
	auto column_ref_expr = !column_ref_left ? expr.right.get() : expr.left.get();
	// the constant_expr is a scalar expression that we have to fold
	// use an ExpressionExecutor to execute the expression
	D_ASSERT(constant_expr.IsFoldable());
	Value constant_value;
	if (!ExpressionExecutor::TryEvaluateScalar(GetContext(), constant_expr, constant_value)) {
		return nullptr;
	}
	if (constant_value.IsNull() && !(expr.GetExpressionType() == ExpressionType::COMPARE_NOT_DISTINCT_FROM ||
	                                 expr.GetExpressionType() == ExpressionType::COMPARE_DISTINCT_FROM)) {
		// comparison with constant NULL, return NULL
		return make_uniq<BoundConstantExpression>(Value(LogicalType::BOOLEAN));
	}
	if (column_ref_expr->GetExpressionClass() == ExpressionClass::BOUND_CAST) {
		//! Here we check if we can apply the expression on the constant side
		//! We can do this if the cast itself is invertible and casting the constant is
		//! invertible in practice.
		auto &cast_expression = column_ref_expr->Cast<BoundCastExpression>();
		auto target_type = cast_expression.source_type();
		if (!BoundCastExpression::CastIsInvertible(target_type, cast_expression.return_type)) {
			return nullptr;
		}

		// Can we cast the constant at all?
		string error_message;
		Value cast_constant;
		auto new_constant =
		    constant_value.TryCastAs(rewriter.context, target_type, cast_constant, &error_message, true);
		if (!new_constant) {
			return nullptr;
		}

		// Is the constant cast invertible?
		if (!cast_constant.IsNull() &&
		    !BoundCastExpression::CastIsInvertible(cast_expression.return_type, target_type)) {
			// Is it actually invertible?
			Value uncast_constant;
			if (!cast_constant.TryCastAs(rewriter.context, constant_value.type(), uncast_constant, &error_message,
			                             true) ||
			    uncast_constant != constant_value) {
				return nullptr;
			}
		}

		//! We can cast, now we change our column_ref_expression from an operator cast to a column reference
		auto child_expression = std::move(cast_expression.child);
		auto new_constant_expr = make_uniq<BoundConstantExpression>(cast_constant);
		if (column_ref_left) {
			expr.left = std::move(child_expression);
			expr.right = std::move(new_constant_expr);
		} else {
			expr.left = std::move(new_constant_expr);
			expr.right = std::move(child_expression);
		}
	}
	return nullptr;
}